

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printDot(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  Ref *this_00;
  Value *this_01;
  char *s;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  print(this,(Value *)*puVar1);
  emit(this,'.');
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  this_01 = Ref::operator->(this_00);
  s = Value::getCString(this_01);
  emit(this,s);
  return;
}

Assistant:

void printDot(Ref node) {
    print(node[1]);
    emit('.');
    emit(node[2]->getCString());
  }